

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O2

void melee_effect_stat(melee_effect_handler_context_t *context,wchar_t stat)

{
  _Bool _Var1;
  source sVar2;
  source origin;
  
  _Var1 = monster_damage_target(context,true);
  if (!_Var1) {
    sVar2 = source_monster(context->mon->midx);
    origin.which = sVar2.which;
    origin._4_4_ = 0;
    origin.what = sVar2.what;
    effect_simple(L'\x11',origin,"0",stat,L'\0',L'\0',L'\0',L'\0',&context->obvious);
  }
  return;
}

Assistant:

static void melee_effect_stat(melee_effect_handler_context_t *context, int stat)
{
	/* Take damage */
	if (monster_damage_target(context, true)) return;

	/* Damage (stat) */
	effect_simple(EF_DRAIN_STAT,
			source_monster(context->mon->midx),
			"0",
			stat,
			0,
			0,
			0,
			0,
			&context->obvious);
}